

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O1

void __thiscall FastPForLib::FastPForTest::SetUp(FastPForTest *this)

{
  pointer pcVar1;
  IntegerCODEC *pIVar2;
  int iVar3;
  ParamType *pPVar4;
  FastPFor<8U> *this_00;
  undefined8 *puVar5;
  logic_error *this_01;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pPVar4 = testing::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam();
  pcVar1 = (pPVar4->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + pPVar4->_M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar3 == 0) {
    this_00 = (FastPFor<8U> *)operator_new(0x78);
    FastPFor<4U>::FastPFor((FastPFor<4U> *)this_00,0x10000);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar3 != 0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      this_01 = (logic_error *)operator_new(0x10);
      std::operator+(&local_48,"Unknown codec ",&local_68);
      std::logic_error::logic_error(this_01,(string *)&local_48);
      *puVar5 = this_01;
      __cxa_throw(puVar5,&std::logic_error*::typeinfo,0);
    }
    this_00 = (FastPFor<8U> *)operator_new(0x78);
    FastPFor<8U>::FastPFor(this_00,0x10000);
  }
  pIVar2 = (this->codec)._M_t.
           super___uniq_ptr_impl<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
           ._M_t.
           super__Tuple_impl<0UL,_FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>
           .super__Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false>._M_head_impl;
  (this->codec)._M_t.
  super___uniq_ptr_impl<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>.
  _M_t.
  super__Tuple_impl<0UL,_FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>
  .super__Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false>._M_head_impl =
       &this_00->super_IntegerCODEC;
  if (pIVar2 != (IntegerCODEC *)0x0) {
    (*pIVar2->_vptr_IntegerCODEC[5])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void SetUp() {
        std::string name = GetParam();
        if (name == "FastPFor128") {
          codec.reset(new FastPFor<4>());
        } else if (name == "FastPFor256") {
          codec.reset(new FastPFor<8>());
        } else {
          throw new std::logic_error("Unknown codec " + name);
        }
      }